

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

bool cmSystemTools::IsOff(char *val)

{
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  reference pcVar5;
  size_type sVar6;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar7;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b0;
  iterator c;
  undefined1 local_1a0 [8];
  string v;
  allocator local_169;
  value_type local_168;
  _Base_ptr local_148;
  undefined1 local_140;
  allocator local_131;
  value_type local_130;
  _Base_ptr local_110;
  undefined1 local_108;
  allocator local_f9;
  value_type local_f8;
  _Base_ptr local_d8;
  undefined1 local_d0;
  allocator local_c1;
  value_type local_c0;
  _Base_ptr local_a0;
  undefined1 local_98;
  allocator local_89;
  value_type local_88;
  _Base_ptr local_68;
  undefined1 local_60;
  allocator local_41;
  value_type local_40;
  size_t local_20;
  size_t len;
  char *val_local;
  
  if ((val == (char *)0x0) || (*val == '\0')) {
    val_local._7_1_ = 1;
  }
  else {
    len = (size_t)val;
    local_20 = strlen(val);
    if (local_20 < 7) {
      if ((IsOff(char_const*)::offValues_abi_cxx11_ == '\0') &&
         (iVar4 = __cxa_guard_acquire(&IsOff(char_const*)::offValues_abi_cxx11_), iVar4 != 0)) {
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::set(&IsOff(char_const*)::offValues_abi_cxx11_);
        __cxa_atexit(std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::~set,&IsOff(char_const*)::offValues_abi_cxx11_,&__dso_handle);
        __cxa_guard_release(&IsOff(char_const*)::offValues_abi_cxx11_);
      }
      bVar3 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&IsOff(char_const*)::offValues_abi_cxx11_);
      if (bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_40,"OFF",&local_41);
        pVar7 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert(&IsOff(char_const*)::offValues_abi_cxx11_,&local_40);
        local_68 = (_Base_ptr)pVar7.first._M_node;
        local_60 = pVar7.second;
        std::__cxx11::string::~string((string *)&local_40);
        std::allocator<char>::~allocator((allocator<char> *)&local_41);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_88,"0",&local_89);
        pVar7 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert(&IsOff(char_const*)::offValues_abi_cxx11_,&local_88);
        local_a0 = (_Base_ptr)pVar7.first._M_node;
        local_98 = pVar7.second;
        std::__cxx11::string::~string((string *)&local_88);
        std::allocator<char>::~allocator((allocator<char> *)&local_89);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_c0,"NO",&local_c1);
        pVar7 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert(&IsOff(char_const*)::offValues_abi_cxx11_,&local_c0);
        local_d8 = (_Base_ptr)pVar7.first._M_node;
        local_d0 = pVar7.second;
        std::__cxx11::string::~string((string *)&local_c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_c1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_f8,"FALSE",&local_f9);
        pVar7 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert(&IsOff(char_const*)::offValues_abi_cxx11_,&local_f8);
        local_110 = (_Base_ptr)pVar7.first._M_node;
        local_108 = pVar7.second;
        std::__cxx11::string::~string((string *)&local_f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_f9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_130,"N",&local_131);
        pVar7 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert(&IsOff(char_const*)::offValues_abi_cxx11_,&local_130);
        local_148 = (_Base_ptr)pVar7.first._M_node;
        local_140 = pVar7.second;
        std::__cxx11::string::~string((string *)&local_130);
        std::allocator<char>::~allocator((allocator<char> *)&local_131);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_168,"IGNORE",&local_169);
        pVar7 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert(&IsOff(char_const*)::offValues_abi_cxx11_,&local_168);
        v.field_2._8_8_ = pVar7.first._M_node;
        std::__cxx11::string::~string((string *)&local_168);
        std::allocator<char>::~allocator((allocator<char> *)&local_169);
      }
      sVar2 = len;
      sVar1 = local_20;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_1a0,(char *)sVar2,sVar1,(allocator *)((long)&c._M_current + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&c._M_current + 7));
      local_1b0._M_current = (char *)std::__cxx11::string::begin();
      while( true ) {
        local_1b8._M_current = (char *)std::__cxx11::string::end();
        bVar3 = __gnu_cxx::operator!=(&local_1b0,&local_1b8);
        if (!bVar3) break;
        pcVar5 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_1b0);
        iVar4 = toupper((int)*pcVar5);
        pcVar5 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_1b0);
        *pcVar5 = (char)iVar4;
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_1b0,0);
      }
      sVar6 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&IsOff(char_const*)::offValues_abi_cxx11_,(key_type *)local_1a0);
      val_local._7_1_ = sVar6 != 0;
      std::__cxx11::string::~string((string *)local_1a0);
    }
    else {
      val_local._7_1_ = IsNOTFOUND((char *)len);
    }
  }
  return (bool)(val_local._7_1_ & 1);
}

Assistant:

bool cmSystemTools::IsOff(const char* val)
{
  if (!val || !*val) {
    return true;
  }
  size_t len = strlen(val);
  // Try and avoid toupper() for large strings.
  if (len > 6) {
    return cmSystemTools::IsNOTFOUND(val);
  }

  static std::set<std::string> offValues;
  if (offValues.empty()) {
    offValues.insert("OFF");
    offValues.insert("0");
    offValues.insert("NO");
    offValues.insert("FALSE");
    offValues.insert("N");
    offValues.insert("IGNORE");
  }
  // Try and avoid toupper().
  std::string v(val, len);
  for (std::string::iterator c = v.begin(); c != v.end(); c++) {
    *c = static_cast<char>(toupper(*c));
  }
  return (offValues.count(v) > 0);
}